

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

void __thiscall
amrex::ParmParse::getktharr
          (ParmParse *this,char *name,int k,vector<int,_std::allocator<int>_> *ptr,int start_ix,
          int num_val)

{
  Table *table;
  allocator local_75;
  int local_74;
  string local_70;
  string local_50;
  
  table = this->m_table;
  local_74 = num_val;
  std::__cxx11::string::string((string *)&local_50,name,&local_75);
  prefixedName(&local_70,this,&local_50);
  anon_unknown_12::anon_unknown_0::sgetarr<int>(table,&local_70,ptr,start_ix,local_74,k);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void
ParmParse::getktharr (const char* name,
                      int         k,
                      std::vector<int>& ptr,
                      int         start_ix,
                      int         num_val) const
{
    sgetarr(m_table, prefixedName(name),ptr,start_ix,num_val,k);
}